

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelside.cpp
# Opt level: O0

void __thiscall TPZGeoElSide::InsertConnectivity(TPZGeoElSide *this,TPZGeoElSide *neighbour)

{
  int64_t iVar1;
  TPZGeoElSide *this_00;
  TPZGeoElSide *in_RSI;
  long in_RDI;
  TPZGeoElSide neighl;
  TPZGeoElSide myl;
  int is;
  int ns;
  TPZStack<int,_10> neighbourlowerdimension;
  TPZStack<int,_10> mylowerdimension;
  int *in_stack_fffffffffffffef0;
  int side;
  TPZGeoEl *gel;
  TPZStack<int,_10> *in_stack_ffffffffffffff00;
  int local_b4;
  TPZVec<int> local_a0 [2];
  TPZVec<int> local_58 [2];
  TPZGeoElSide *in_stack_ffffffffffffffe8;
  
  if ((*(long *)(in_RDI + 8) != 0) && (in_RSI->fGeoEl != (TPZGeoEl *)0x0)) {
    TPZStack<int,_10>::TPZStack(in_stack_ffffffffffffff00);
    TPZStack<int,_10>::TPZStack(in_stack_ffffffffffffff00);
    (**(code **)(**(long **)(in_RDI + 8) + 0x220))
              (*(long **)(in_RDI + 8),*(undefined4 *)(in_RDI + 0x10),local_58);
    (**(code **)(*(long *)in_RSI->fGeoEl + 0x220))(in_RSI->fGeoEl,in_RSI->fSide,local_a0);
    SetConnectivity(in_RSI,in_stack_ffffffffffffffe8);
    iVar1 = TPZVec<int>::NElements(local_58);
    for (local_b4 = 0; side = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20), local_b4 < (int)iVar1
        ; local_b4 = local_b4 + 1) {
      gel = *(TPZGeoEl **)(in_RDI + 8);
      this_00 = (TPZGeoElSide *)TPZVec<int>::operator[](local_58,(long)local_b4);
      TPZGeoElSide(this_00,gel,side);
      in_stack_fffffffffffffef0 = TPZVec<int>::operator[](local_a0,(long)local_b4);
      TPZGeoElSide(this_00,gel,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
      SetConnectivity(in_RSI,in_stack_ffffffffffffffe8);
      ~TPZGeoElSide((TPZGeoElSide *)0x19e08aa);
      ~TPZGeoElSide((TPZGeoElSide *)0x19e08b4);
    }
    TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x19e0922);
    TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x19e092f);
  }
  return;
}

Assistant:

void TPZGeoElSide::InsertConnectivity(TPZGeoElSide &neighbour)
{
	if(!fGeoEl || !neighbour.fGeoEl) return;
	
	TPZStack<int> mylowerdimension, neighbourlowerdimension;
	fGeoEl->LowerDimensionSides(fSide,mylowerdimension);
	neighbour.fGeoEl->LowerDimensionSides(neighbour.fSide,neighbourlowerdimension);
	SetConnectivity(neighbour);
	int ns = mylowerdimension.NElements();
	int is;
	for(is=0; is<ns; is++)
	{
		TPZGeoElSide myl(fGeoEl,mylowerdimension[is]);
		TPZGeoElSide neighl(neighbour.fGeoEl,neighbourlowerdimension[is]);
#ifdef PZDEBUG
        std::set<int64_t> mynodes,neighnodes;
        int nsidenodes = myl.NSideNodes();
        for (int is = 0; is<nsidenodes; is++) {
            mynodes.insert(myl.SideNodeIndex(is));
            neighnodes.insert(neighl.SideNodeIndex(is));
        }
        if(mynodes != neighnodes) DebugStop();
#endif
		myl.SetConnectivity(neighl);
	}
}